

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O1

int __thiscall asmjit::Assembler::bind(Assembler *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  long *plVar1;
  CodeHolder *pCVar2;
  Logger *pLVar3;
  Slot *pSVar4;
  uint8_t *puVar5;
  Error EVar6;
  long lVar7;
  socklen_t __len_00;
  socklen_t extraout_EDX;
  ulong uVar8;
  Slot *extraout_RDX;
  undefined4 in_register_00000034;
  sockaddr *psVar10;
  Assembler *pAVar11;
  sockaddr *psVar12;
  uint8_t uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  StringBuilderTmp<256UL> sb;
  StringBuilder local_148;
  char local_128 [264];
  Slot *pSVar9;
  
  __len_00 = (socklen_t)__addr;
  psVar10 = (sockaddr *)CONCAT44(in_register_00000034,__fd);
  EVar6 = (this->super_CodeEmitter)._lastError;
  if (EVar6 != 0) {
    return EVar6;
  }
  pCVar2 = (this->super_CodeEmitter)._code;
  pAVar11 = this;
  if (pCVar2 == (CodeHolder *)0x0) {
LAB_0015e6d6:
    bind((int)pAVar11,psVar10,__len_00);
  }
  else {
    uVar8 = (ulong)(*(int *)(psVar10->sa_data + 2) - 0x100);
    if (uVar8 < (pCVar2->_labels).super_ZoneVectorBase._length) {
      lVar16 = *(long *)((long)(pCVar2->_labels).super_ZoneVectorBase._data + uVar8 * 8);
    }
    else {
      lVar16 = 0;
    }
    if (lVar16 != 0) {
      if (*(int *)(lVar16 + 0x18) == -1) {
        if (((this->super_CodeEmitter)._globalOptions & 4) != 0) {
          local_148._data = local_128;
          local_128[0] = '\0';
          local_148._length = 0;
          local_148._capacity = 0x100;
          local_148._canFree = 0;
          if (*(uint *)(lVar16 + 0x30) == 0) {
            StringBuilder::setFormat(&local_148,"L%u:");
          }
          else {
            if (*(uint *)(lVar16 + 0x30) < 0xc) {
              lVar7 = lVar16 + 0x34;
            }
            else {
              lVar7 = *(long *)(lVar16 + 0x38);
            }
            StringBuilder::setFormat(&local_148,"%s:",lVar7);
          }
          Logging::formatLine(&local_148,(uint8_t *)0x0,
                              (ulong)(((this->super_CodeEmitter)._code)->_logger->_options & 1) - 1,
                              0,0,(this->super_CodeEmitter)._inlineComment);
          pLVar3 = ((this->super_CodeEmitter)._code)->_logger;
          (*pLVar3->_vptr_Logger[2])(pLVar3,local_148._data,local_148._length);
          StringBuilder::~StringBuilder(&local_148);
        }
        lVar7 = (long)this->_bufferPtr - (long)this->_bufferData;
        psVar10 = (sockaddr *)0x0;
        if (*(Slot **)(lVar16 + 0x28) != (Slot *)0x0) {
          pAVar11 = (Assembler *)0xffffffff;
          pSVar9 = *(Slot **)(lVar16 + 0x28);
          psVar12 = (sockaddr *)0x0;
          do {
            psVar10 = (sockaddr *)(ulong)*(uint *)((long)&pSVar9[1].next + 4);
            if (psVar10 != (sockaddr *)0xffffffff) {
              pCVar2 = (this->super_CodeEmitter)._code;
              if (psVar10 < (sockaddr *)(pCVar2->_relocations).super_ZoneVectorBase._length) {
                plVar1 = (long *)(*(long *)((long)(pCVar2->_relocations).super_ZoneVectorBase._data
                                           + (long)psVar10 * 8) + 0x18);
                *plVar1 = *plVar1 + lVar7;
                psVar10 = psVar12;
                goto LAB_0015e625;
              }
LAB_0015e6d1:
              bind((int)pAVar11,psVar10,(socklen_t)pSVar9);
              __len_00 = extraout_EDX;
              goto LAB_0015e6d6;
            }
            pSVar4 = pSVar9[2].next;
            lVar15 = (lVar7 - (long)pSVar4) + (long)pSVar9[3].next;
            puVar5 = this->_bufferData;
            iVar14 = (int)lVar15;
            psVar10 = (sockaddr *)0x2a;
            if (puVar5[(long)pSVar4] == '\x01') {
              uVar13 = (uint8_t)lVar15;
              if ((char)uVar13 == iVar14) {
                puVar5[(long)pSVar4] = uVar13;
                psVar10 = psVar12;
              }
            }
            else if (puVar5[(long)pSVar4] == '\x04') {
              *(int *)(puVar5 + (long)pSVar4) = iVar14;
              psVar10 = psVar12;
            }
LAB_0015e625:
            pSVar4 = pSVar9->next;
            pCVar2 = (this->super_CodeEmitter)._code;
            pCVar2->_unresolvedLabelsCount = pCVar2->_unresolvedLabelsCount - 1;
            if ((pCVar2->_baseHeap)._zone == (Zone *)0x0) {
              bind(-1,psVar10,(socklen_t)pSVar9);
              pSVar9 = extraout_RDX;
              goto LAB_0015e6d1;
            }
            pSVar9->next = (pCVar2->_baseHeap)._slots[0];
            (pCVar2->_baseHeap)._slots[0] = pSVar9;
            pSVar9 = pSVar4;
            psVar12 = psVar10;
          } while (pSVar4 != (Slot *)0x0);
        }
        *(uint32_t *)(lVar16 + 0x18) = this->_section->_id;
        *(long *)(lVar16 + 0x20) = lVar7;
        *(undefined8 *)(lVar16 + 0x28) = 0;
        (this->super_CodeEmitter)._inlineComment = (char *)0x0;
        EVar6 = (Error)psVar10;
        if (EVar6 == 0) {
          return 0;
        }
      }
      else {
        EVar6 = 0xe;
      }
      goto LAB_0015e6b4;
    }
  }
  EVar6 = 0xc;
LAB_0015e6b4:
  EVar6 = CodeEmitter::setLastError(&this->super_CodeEmitter,EVar6,(char *)0x0);
  return EVar6;
}

Assistant:

Error Assembler::bind(const Label& label) {
  if (_lastError) return _lastError;
  ASMJIT_ASSERT(_code != nullptr);

  LabelEntry* le = _code->getLabelEntry(label);
  if (ASMJIT_UNLIKELY(!le))
    return setLastError(DebugUtils::errored(kErrorInvalidLabel));

  // Label can be bound only once.
  if (ASMJIT_UNLIKELY(le->isBound()))
    return setLastError(DebugUtils::errored(kErrorLabelAlreadyBound));

#if !defined(ASMJIT_DISABLE_LOGGING)
  if (_globalOptions & kOptionLoggingEnabled) {
    StringBuilderTmp<256> sb;
    if (le->hasName())
      sb.setFormat("%s:", le->getName());
    else
      sb.setFormat("L%u:", Operand::unpackId(label.getId()));

    size_t binSize = 0;
    if (!_code->_logger->hasOption(Logger::kOptionBinaryForm))
      binSize = Globals::kInvalidIndex;

    Logging::formatLine(sb, nullptr, binSize, 0, 0, getInlineComment());
    _code->_logger->log(sb.getData(), sb.getLength());
  }
#endif // !ASMJIT_DISABLE_LOGGING

  Error err = kErrorOk;
  size_t pos = getOffset();

  LabelLink* link = le->_links;
  LabelLink* prev = nullptr;

  while (link) {
    intptr_t offset = link->offset;
    uint32_t relocId = link->relocId;

    if (relocId != RelocEntry::kInvalidId) {
      // Adjust relocation data.
      RelocEntry* re = _code->_relocations[relocId];
      re->_data += static_cast<uint64_t>(pos);
    }
    else {
      // Not using relocId, this means that we are overwriting a real
      // displacement in the CodeBuffer.
      int32_t patchedValue = static_cast<int32_t>(
        static_cast<intptr_t>(pos) - offset + link->rel);

      // Size of the value we are going to patch. Only BYTE/DWORD is allowed.
      uint32_t size = _bufferData[offset];
      if (size == 4)
        Utils::writeI32u(_bufferData + offset, static_cast<int32_t>(patchedValue));
      else if (size == 1 && Utils::isInt8(patchedValue))
        _bufferData[offset] = static_cast<uint8_t>(patchedValue & 0xFF);
      else
        err = DebugUtils::errored(kErrorInvalidDisplacement);
    }

    prev = link->prev;
    _code->_unresolvedLabelsCount--;
    _code->_baseHeap.release(link, sizeof(LabelLink));

    link = prev;
  }

  // Set as bound.
  le->_sectionId = _section->getId();
  le->_offset = pos;
  le->_links = nullptr;
  resetInlineComment();

  if (err != kErrorOk)
    return setLastError(err);

  return kErrorOk;
}